

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O0

Solver * __thiscall
Clasp::SharedContext::startAddConstraints(SharedContext *this,uint32 constraintGuess)

{
  bool bVar1;
  ConfigPtr pCVar2;
  SharedContext *in_RDI;
  SolverParams *in_stack_00000030;
  uint32 in_stack_0000003c;
  undefined4 in_stack_00000040;
  uint32 in_stack_0000007c;
  ShortImplicationsGraph *in_stack_00000080;
  Literal *in_stack_ffffffffffffffa8;
  Literal *in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  Solver *local_8;
  
  bVar1 = unfreeze((SharedContext *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  if (bVar1) {
    numVars((SharedContext *)0x1d545c);
    lit_false();
    bVar1 = Clasp::operator==(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if (!bVar1) {
      solveMode(in_RDI);
    }
    ShortImplicationsGraph::resize(in_stack_00000080,in_stack_0000007c);
    master((SharedContext *)0x1d54d3);
    pCVar2 = configuration((SharedContext *)0x1d54ea);
    (*pCVar2->_vptr_Configuration[6])(pCVar2,0);
    Solver::startInit((Solver *)CONCAT44(constraintGuess,in_stack_00000040),in_stack_0000003c,
                      in_stack_00000030);
    local_8 = master((SharedContext *)0x1d5510);
  }
  else {
    local_8 = master((SharedContext *)0x1d543a);
  }
  return local_8;
}

Assistant:

Solver& SharedContext::startAddConstraints(uint32 constraintGuess) {
	if (!unfreeze()) { return *master(); }
	btig_.resize((numVars() + 1 + uint32(step_ == lit_false() || solveMode() == solve_multi))<<1);
	master()->startInit(constraintGuess, configuration()->solver(0));
	return *master();
}